

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

Rect<int> eos::render::detail::calculate_clipped_bounding_box<float>
                    (Vector2<float> *v0,Vector2<float> *v1,Vector2<float> *v2,int viewport_width,
                    int viewport_height)

{
  Rect<int> RVar1;
  CoeffReturnType pfVar2;
  float *pfVar3;
  double dVar4;
  float local_88;
  float local_84;
  float local_80;
  float local_7c [2];
  float local_74;
  int maxY;
  float local_6c;
  float local_68;
  int local_64;
  float local_60;
  int minY;
  float local_58;
  float local_54;
  int local_50;
  float local_4c;
  int maxX;
  float local_44;
  float local_40;
  int local_3c;
  int local_38;
  int minX;
  int viewport_height_local;
  int viewport_width_local;
  Vector2<float> *v2_local;
  Vector2<float> *v1_local;
  Vector2<float> *v0_local;
  
  local_38 = viewport_height;
  minX = viewport_width;
  _viewport_height_local = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v2;
  v2_local = v1;
  v1_local = v0;
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v0,0);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  local_40 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v2_local,0);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  local_44 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     (_viewport_height_local,0);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  maxX = SUB84(dVar4,0);
  pfVar3 = std::min<float>(&local_44,(float *)&maxX);
  pfVar3 = std::min<float>(&local_40,pfVar3);
  local_4c = 0.0;
  pfVar3 = std::max<float>(pfVar3,&local_4c);
  local_3c = (int)*pfVar3;
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v1_local,0);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  local_54 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v2_local,0);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  local_58 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     (_viewport_height_local,0);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  minY = SUB84(dVar4,0);
  pfVar3 = std::max<float>(&local_58,(float *)&minY);
  pfVar3 = std::max<float>(&local_54,pfVar3);
  local_60 = (float)(minX + -1);
  pfVar3 = std::min<float>(pfVar3,&local_60);
  local_50 = (int)*pfVar3;
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v1_local,1);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  local_68 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v2_local,1);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  local_6c = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     (_viewport_height_local,1);
  dVar4 = std::floor((double)(ulong)(uint)*pfVar2);
  maxY = SUB84(dVar4,0);
  pfVar3 = std::min<float>(&local_6c,(float *)&maxY);
  pfVar3 = std::min<float>(&local_68,pfVar3);
  local_74 = 0.0;
  pfVar3 = std::max<float>(pfVar3,&local_74);
  local_64 = (int)*pfVar3;
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v1_local,1);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  local_7c[0] = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)v2_local,1);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  local_80 = SUB84(dVar4,0);
  pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                     (_viewport_height_local,1);
  dVar4 = std::ceil((double)(ulong)(uint)*pfVar2);
  local_84 = SUB84(dVar4,0);
  pfVar3 = std::max<float>(&local_80,&local_84);
  pfVar3 = std::max<float>(local_7c,pfVar3);
  local_88 = (float)(local_38 + -1);
  pfVar3 = std::min<float>(pfVar3,&local_88);
  RVar1.y = local_64;
  RVar1.x = local_3c;
  RVar1.width = local_50 - local_3c;
  RVar1.height = (int)*pfVar3 - local_64;
  return RVar1;
}

Assistant:

core::Rect<int> calculate_clipped_bounding_box(const Eigen::Vector2<T>& v0, const Eigen::Vector2<T>& v1,
                                               const Eigen::Vector2<T>& v2, int viewport_width,
                                               int viewport_height)
{
    /* Old, producing artifacts:
    t.minX = max(min(t.v0.position[0], min(t.v1.position[0], t.v2.position[0])), 0.0f);
    t.maxX = min(max(t.v0.position[0], max(t.v1.position[0], t.v2.position[0])), (float)(viewportWidth - 1));
    t.minY = max(min(t.v0.position[1], min(t.v1.position[1], t.v2.position[1])), 0.0f);
    t.maxY = min(max(t.v0.position[1], max(t.v1.position[1], t.v2.position[1])), (float)(viewportHeight -
    1));*/

    using std::ceil;
    using std::floor;
    using std::max;
    using std::min;
    // Readded this comment after merge: What about rounding, or rather the conversion from double to int?
    const int minX = max(min(floor(v0[0]), min(floor(v1[0]), floor(v2[0]))), T(0));
    const int maxX = min(max(ceil(v0[0]), max(ceil(v1[0]), ceil(v2[0]))), static_cast<T>(viewport_width - 1));
    const int minY = max(min(floor(v0[1]), min(floor(v1[1]), floor(v2[1]))), T(0));
    const int maxY = min(max(ceil(v0[1]), max(ceil(v1[1]), ceil(v2[1]))), static_cast<T>(viewport_height - 1));
    return core::Rect<int>{minX, minY, maxX - minX, maxY - minY};
}